

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::MeshLoader::initializeNormalsOffset(MeshLoader *this)

{
  uint uVar1;
  InputShared *pIVar2;
  SourceBase *pSVar3;
  bool bVar4;
  
  pIVar2 = MeshPrimitiveInputList::getNormalInput(&this->mMeshPrimitiveInputs);
  if (pIVar2 != (InputShared *)0x0) {
    this->mNormalsOffset = pIVar2->mOffset;
    pSVar3 = SourceArrayLoader::getSourceById
                       (&this->super_SourceArrayLoader,
                        &(pIVar2->super_InputUnshared).mSource.mFragment);
    if (pSVar3 != (SourceBase *)0x0) {
      uVar1 = 0;
      bVar4 = false;
      if (pSVar3->mStride == 3) {
        uVar1 = (uint)(pSVar3->mInitialIndex / 3);
        bVar4 = true;
      }
      goto LAB_0083d1ac;
    }
  }
  uVar1 = 0;
  bVar4 = false;
LAB_0083d1ac:
  this->mNormalsIndexOffset = uVar1;
  this->mUseNormals = bVar4;
  return;
}

Assistant:

void MeshLoader::initializeNormalsOffset ()
    {
        // Check for using normals
        const InputShared* normalInput = mMeshPrimitiveInputs.getNormalInput ();
        if ( normalInput != 0 ) 
        {
            // Get the offset value, the initial index values and alloc the memory.
            mNormalsOffset = normalInput->getOffset ();
            const SourceBase* sourceBase = getSourceById ( normalInput->getSource ().getFragment () );
            if ( !sourceBase )
            {
                mNormalsIndexOffset = 0;
                mUseNormals = false;
            }
            else 
            {
                // only stride 3 makes sense for normals
                unsigned long long stride = sourceBase->getStride();
                if ( stride == 3 )
                {
                    mNormalsIndexOffset = (unsigned int)(sourceBase->getInitialIndex() / stride);
                    mUseNormals = true;
                }
                else
                {
                    mNormalsIndexOffset = 0;
                    mUseNormals = false;
                }
            }
        }
        else
        {
            mNormalsIndexOffset = 0;
            mUseNormals = false;
        }
    }